

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O3

void __thiscall despot::RegDemo::ComputeDefaultActions(RegDemo *this,string *type)

{
  long lVar1;
  pointer piVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Default action = ",0x11)
  ;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(type->_M_dataplus)._M_p,type->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  iVar3 = std::__cxx11::string::compare((char *)type);
  if (iVar3 == 0) {
    (**(code **)(*(long *)&this->super_MDP + 0x30))(&this->super_MDP);
    uVar4 = (**(code **)(*(long *)this + 0xd0))(this);
    std::vector<int,_std::allocator<int>_>::resize(&this->default_action_,(long)(int)uVar4);
    if (0 < (int)uVar4) {
      lVar1 = *(long *)&this->field_0x10;
      piVar2 = (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        *(undefined4 *)((long)piVar2 + lVar6) = *(undefined4 *)(lVar1 + lVar6 * 4);
        lVar6 = lVar6 + 4;
      } while ((ulong)uVar4 << 2 != lVar6);
    }
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Unsupported default action type ");
  poVar5 = std::operator<<(poVar5,(string *)type);
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(0);
}

Assistant:

void RegDemo::ComputeDefaultActions(string type) const {
	cerr << "Default action = " << type << endl;
	if (type == "MDP") {
		const_cast<RegDemo*>(this)->ComputeOptimalPolicyUsingVI();
		int num_states = NumStates();
		default_action_.resize(num_states);

		double value = 0;
		for (int s = 0; s < num_states; s++) {
			default_action_[s] = policy_[s].action;
			value += policy_[s].value;
		}
	} else {
		cerr << "Unsupported default action type " << type << endl;
		exit(0);
	}
}